

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  ulong __n;
  cmTargetInternals *pcVar1;
  char *__s1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  PolicyStatus PVar7;
  cmGlobalGenerator *pcVar8;
  cmGeneratorTarget *pcVar9;
  size_type sVar10;
  char *pcVar11;
  size_type sVar12;
  size_t sVar13;
  cmSourceFile *this_00;
  cmSourceFileLocation *pcVar14;
  ostream *poVar15;
  cmState *this_01;
  PolicyID id;
  pointer pbVar16;
  string objLibName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream e;
  ostringstream e_1;
  undefined1 auStack_398 [12];
  undefined4 local_38c;
  string local_388;
  string local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  string *local_328;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) &&
     (bVar3 = whiteListedInterfaceProperty(prop), !bVar3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,
               "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \"",
               0x4f);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,(prop->_M_dataplus)._M_p,prop->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" is not allowed.",0x11);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,(string *)local_1a8,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,
                      CONCAT17(local_1a8[0x17],
                               CONCAT43(local_1a8._19_4_,CONCAT21(local_1a8._17_2_,local_1a8[0x10]))
                              ) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    return (char *)0x0;
  }
  if ((this->TargetTypeValue < OBJECT_LIBRARY) || (this->TargetTypeValue == UNKNOWN_LIBRARY)) {
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_ == '\0') {
      GetProperty();
    }
    __n = prop->_M_string_length;
    if ((__n == GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_.
                _M_string_length) &&
       ((__n == 0 ||
        (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                      GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_.
                      _M_dataplus._M_p,__n), iVar6 == 0)))) {
      bVar3 = HandleLocationPropertyPolicy(this,context);
      if (!bVar3) {
        return (char *)0x0;
      }
      if (this->IsImportedTarget == true) {
        local_1a8._8_8_ = 0;
        local_1a8[0x10] = '\0';
        local_1a8._0_8_ = local_1a8 + 0x10;
        ImportedGetFullPath((string *)local_320,this,(string *)local_1a8,false);
        cmPropertyMap::SetProperty
                  (&this->Properties,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                   (char *)local_320._0_8_);
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_0028da1b;
      }
      else {
        pcVar8 = cmMakefile::GetGlobalGenerator(this->Makefile);
        cmGlobalGenerator::CreateGenerationObjects(pcVar8,AllTargets);
        pcVar9 = cmGlobalGenerator::FindGeneratorTarget(pcVar8,&this->Name);
        pcVar11 = cmGeneratorTarget::GetLocationForBuild(pcVar9);
        cmPropertyMap::SetProperty
                  (&this->Properties,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                   pcVar11);
      }
    }
    else {
      pcVar11 = (prop->_M_dataplus)._M_p;
      iVar6 = strncmp(pcVar11,"LOCATION_",9);
      if (iVar6 == 0) {
        bVar3 = HandleLocationPropertyPolicy(this,context);
        if (!bVar3) {
          return (char *)0x0;
        }
        pcVar11 = (prop->_M_dataplus)._M_p + 9;
        if (this->IsImportedTarget == true) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          sVar13 = strlen(pcVar11);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pcVar11,pcVar11 + sVar13);
          ImportedGetFullPath((string *)local_320,this,(string *)local_1a8,false);
          cmPropertyMap::SetProperty(&this->Properties,prop,(char *)local_320._0_8_);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_0028da1b:
            operator_delete((void *)local_1a8._0_8_,
                            CONCAT17(local_1a8[0x17],
                                     CONCAT43(local_1a8._19_4_,
                                              CONCAT21(local_1a8._17_2_,local_1a8[0x10]))) + 1);
          }
        }
        else {
          pcVar8 = cmMakefile::GetGlobalGenerator(this->Makefile);
          cmGlobalGenerator::CreateGenerationObjects(pcVar8,AllTargets);
          pcVar9 = cmGlobalGenerator::FindGeneratorTarget(pcVar8,&this->Name);
          local_1a8._0_8_ = local_1a8 + 0x10;
          sVar13 = strlen(pcVar11);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pcVar11,pcVar11 + sVar13);
          cmGeneratorTarget::GetFullPath((string *)local_320,pcVar9,(string *)local_1a8,false,false)
          ;
          cmPropertyMap::SetProperty(&this->Properties,prop,(char *)local_320._0_8_);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_0028da1b;
        }
      }
      else if (8 < __n) {
        iVar6 = strcmp(pcVar11 + (__n - 9),"_LOCATION");
        if (iVar6 == 0) {
          local_320._0_8_ = local_320 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_320,pcVar11,pcVar11 + (__n - 9));
          iVar6 = std::__cxx11::string::compare(local_320);
          bVar3 = true;
          if (iVar6 != 0) {
            bVar4 = HandleLocationPropertyPolicy(this,context);
            if (bVar4) {
              if (this->IsImportedTarget == true) {
                ImportedGetFullPath((string *)local_1a8,this,(string *)local_320,false);
                cmPropertyMap::SetProperty(&this->Properties,prop,(char *)local_1a8._0_8_);
              }
              else {
                pcVar8 = cmMakefile::GetGlobalGenerator(this->Makefile);
                cmGlobalGenerator::CreateGenerationObjects(pcVar8,AllTargets);
                pcVar9 = cmGlobalGenerator::FindGeneratorTarget(pcVar8,&this->Name);
                cmGeneratorTarget::GetFullPath
                          ((string *)local_1a8,pcVar9,(string *)local_320,false,false);
                cmPropertyMap::SetProperty(&this->Properties,prop,(char *)local_1a8._0_8_);
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT17(local_1a8[0x17],
                                         CONCAT43(local_1a8._19_4_,
                                                  CONCAT21(local_1a8._17_2_,local_1a8[0x10]))) + 1);
              }
            }
            else {
              bVar3 = false;
            }
          }
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          if (!bVar3) {
            return (char *)0x0;
          }
        }
      }
    }
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   specialProps_abi_cxx11_), iVar6 != 0)) {
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hashtable(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht
                ,100,(hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_320,
                (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1a8,(allocator_type *)&local_368);
    __cxa_atexit(cmsys::
                 hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                 ::~hash_set,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         specialProps_abi_cxx11_);
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar6 != 0)) {
    GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                   propINCLUDE_DIRECTORIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar6 != 0)) {
    GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                   propCOMPILE_FEATURES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
  {
    GetProperty();
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar6 != 0)) {
    GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                   propCOMPILE_DEFINITIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
      _M_num_elements == 0) {
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,1)
    ;
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_)
    ;
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_FEATURES_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_
              );
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
             GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
             _M_num_elements + 1);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert_unique_noresize
              ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)local_320,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_);
  }
  sVar10 = cmsys::
           hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           ::count(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                    _M_ht,prop);
  if (sVar10 != 0) {
    sVar13 = prop->_M_string_length;
    if ((sVar13 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                   propLINK_LIBRARIES_abi_cxx11_._M_string_length) &&
       ((sVar13 == 0 ||
        (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                      GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                      propLINK_LIBRARIES_abi_cxx11_._M_dataplus._M_p,sVar13), iVar6 == 0)))) {
      pcVar1 = (this->Internal).Pointer;
      if ((pcVar1->LinkImplementationPropertyEntries).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar1->LinkImplementationPropertyEntries).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_320,
                   &((this->Internal).Pointer)->LinkImplementationPropertyEntries,";");
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                   (string *)local_320);
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
        return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
               _M_p;
      }
    }
    else {
      if ((sVar13 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_.
                     _M_string_length) &&
         ((sVar13 == 0 ||
          (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                        GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_.
                        _M_dataplus._M_p,sVar13), iVar6 == 0)))) {
        pcVar11 = cmState::GetTargetTypeName(this->TargetTypeValue);
        return pcVar11;
      }
      if ((sVar13 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                     propINCLUDE_DIRECTORIES_abi_cxx11_._M_string_length) &&
         ((sVar13 == 0 ||
          (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                        GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                        propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p,sVar13), iVar6 == 0))))
      {
        pcVar1 = (this->Internal).Pointer;
        if ((pcVar1->IncludeDirectoriesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar1->IncludeDirectoriesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_320,&((this->Internal).Pointer)->IncludeDirectoriesEntries,";")
          ;
          std::__cxx11::string::operator=
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                     (string *)local_320);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
            return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                   _M_dataplus._M_p;
          }
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else if ((sVar13 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                          propCOMPILE_FEATURES_abi_cxx11_._M_string_length) &&
              ((sVar13 == 0 ||
               (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                             GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                             propCOMPILE_FEATURES_abi_cxx11_._M_dataplus._M_p,sVar13), iVar6 == 0)))
              ) {
        pcVar1 = (this->Internal).Pointer;
        if ((pcVar1->CompileFeaturesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar1->CompileFeaturesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_320,&((this->Internal).Pointer)->CompileFeaturesEntries,";");
          std::__cxx11::string::operator=
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                     (string *)local_320);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
            return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                   _M_dataplus._M_p;
          }
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else if ((sVar13 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                          propCOMPILE_OPTIONS_abi_cxx11_._M_string_length) &&
              ((sVar13 == 0 ||
               (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                             GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                             propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p,sVar13), iVar6 == 0))))
      {
        pcVar1 = (this->Internal).Pointer;
        if ((pcVar1->CompileOptionsEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar1->CompileOptionsEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_320,&((this->Internal).Pointer)->CompileOptionsEntries,";");
          std::__cxx11::string::operator=
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                     (string *)local_320);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
            return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                   _M_dataplus._M_p;
          }
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else {
        if ((sVar13 != GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                       propCOMPILE_DEFINITIONS_abi_cxx11_._M_string_length) ||
           ((sVar13 != 0 &&
            (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                          GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                          propCOMPILE_DEFINITIONS_abi_cxx11_._M_dataplus._M_p,sVar13), iVar6 != 0)))
           ) {
          if ((sVar13 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propIMPORTED_abi_cxx11_._M_string_length) &&
             ((sVar13 == 0 ||
              (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                            GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                            propIMPORTED_abi_cxx11_._M_dataplus._M_p,sVar13), iVar6 == 0)))) {
            if (this->IsImportedTarget != false) {
              return "TRUE";
            }
            return "FALSE";
          }
          if ((sVar13 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_.
                         _M_string_length) &&
             ((sVar13 == 0 ||
              (iVar6 = bcmp((prop->_M_dataplus)._M_p,
                            GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                            propNAME_abi_cxx11_._M_dataplus._M_p,sVar13), iVar6 == 0)))) {
            return (this->Name)._M_dataplus._M_p;
          }
          _Var5 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                        propBINARY_DIR_abi_cxx11_);
          if (_Var5) {
            pcVar11 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
            return pcVar11;
          }
          _Var5 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                        propSOURCE_DIR_abi_cxx11_);
          if (_Var5) {
            pcVar11 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
            return pcVar11;
          }
          _Var5 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                        propSOURCES_abi_cxx11_);
          if (_Var5) {
            pcVar1 = (this->Internal).Pointer;
            if ((pcVar1->SourceEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pcVar1->SourceEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              return (char *)0x0;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
            pcVar1 = (this->Internal).Pointer;
            pbVar16 = (pcVar1->SourceEntries).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pbVar16 !=
                (pcVar1->SourceEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pcVar11 = "";
              do {
                local_348.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
                local_348.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
                local_348.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_328 = pbVar16;
                cmSystemTools::ExpandListArgument(pbVar16,&local_348,false);
                for (pbVar16 = local_348.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pbVar16 !=
                    local_348.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar16 = pbVar16 + 1) {
                  __s1 = (pbVar16->_M_dataplus)._M_p;
                  iVar6 = strncmp(__s1,"$<TARGET_OBJECTS:",0x11);
                  if ((iVar6 == 0) && (__s1[pbVar16->_M_string_length - 1] == '>')) {
                    std::__cxx11::string::substr((ulong)&local_368,(ulong)pbVar16);
                    sVar12 = cmGeneratorExpression::Find(&local_368);
                    if (sVar12 == 0xffffffffffffffff) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      PVar7 = cmMakefile::GetPolicyStatus(context,CMP0051);
                      if (PVar7 - NEW < 3) {
                        local_38c = (undefined4)CONCAT71((uint7)(uint3)(PVar7 >> 8),1);
                        bVar3 = true;
                      }
                      else if (PVar7 == WARN) {
                        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_388,(cmPolicies *)0x33,id);
                        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,local_388._M_dataplus._M_p,
                                             local_388._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_388._M_dataplus._M_p != &local_388.field_2) {
                          operator_delete(local_388._M_dataplus._M_p,
                                          local_388.field_2._M_allocated_capacity + 1);
                        }
                        local_38c = 0;
                        bVar3 = false;
                      }
                      else {
                        bVar3 = true;
                        local_38c = 0;
                      }
                      if (!bVar3) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"Target \"",8);
                        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                                             (this->Name)._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,
                                   "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                                   ,0x12d);
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(context,AUTHOR_WARNING,&local_388,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_388._M_dataplus._M_p != &local_388.field_2) {
                          operator_delete(local_388._M_dataplus._M_p,
                                          local_388.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if ((char)local_38c != '\0') {
                        std::operator<<((ostream *)local_320,pcVar11);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,(pbVar16->_M_dataplus)._M_p,
                                   pbVar16->_M_string_length);
                        pcVar11 = ";";
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                      std::ios_base::~ios_base(local_138);
                    }
                    else {
                      if (pcVar11 == (char *)0x0) {
                        std::ios::clear((int)auStack_398 +
                                        (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x78);
                      }
                      else {
                        sVar13 = strlen(pcVar11);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,pcVar11,sVar13);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
                      pcVar11 = ";";
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_368._M_dataplus._M_p != &local_368.field_2) {
                      operator_delete(local_368._M_dataplus._M_p,
                                      local_368.field_2._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    sVar12 = cmGeneratorExpression::Find(pbVar16);
                    if (sVar12 == 0xffffffffffffffff) {
                      if (pcVar11 == (char *)0x0) {
                        std::ios::clear((int)auStack_398 +
                                        (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x78);
                      }
                      else {
                        sVar13 = strlen(pcVar11);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,pcVar11,sVar13);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
                      pcVar11 = ";";
                    }
                    else {
                      this_00 = cmMakefile::GetOrCreateSource(this->Makefile,pbVar16,false);
                      pcVar14 = cmSourceFile::GetLocation(this_00);
                      local_1a8._0_8_ = local_1a8 + 0x10;
                      pcVar2 = (pcVar14->Directory)._M_dataplus._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1a8,pcVar2,
                                 pcVar2 + (pcVar14->Directory)._M_string_length);
                      if (local_1a8._8_8_ != 0) {
                        std::__cxx11::string::append(local_1a8);
                      }
                      std::__cxx11::string::_M_append
                                (local_1a8,(ulong)(pcVar14->Name)._M_dataplus._M_p);
                      if (pcVar11 == (char *)0x0) {
                        std::ios::clear((int)auStack_398 +
                                        (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x78);
                      }
                      else {
                        sVar13 = strlen(pcVar11);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,pcVar11,sVar13);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(char *)local_1a8._0_8_,local_1a8._8_8_);
                      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                        operator_delete((void *)local_1a8._0_8_,
                                        CONCAT17(local_1a8[0x17],
                                                 CONCAT43(local_1a8._19_4_,
                                                          CONCAT21(local_1a8._17_2_,local_1a8[0x10])
                                                         )) + 1);
                      }
                      pcVar11 = ";";
                    }
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_348);
                pbVar16 = local_328 + 1;
              } while (pbVar16 !=
                       (((this->Internal).Pointer)->SourceEntries).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            local_1a8[0x10] = 'S';
            local_1a8._17_2_ = 0x554f;
            local_1a8._19_4_ = 0x53454352;
            local_1a8._8_8_ = 7;
            local_1a8[0x17] = '\0';
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::stringbuf::str();
            cmPropertyMap::SetProperty
                      (&this->Properties,(string *)local_1a8,local_368._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,
                              CONCAT17(local_1a8[0x17],
                                       CONCAT43(local_1a8._19_4_,
                                                CONCAT21(local_1a8._17_2_,local_1a8[0x10]))) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
            std::ios_base::~ios_base(local_2b0);
          }
          goto LAB_0028e6d8;
        }
        pcVar1 = (this->Internal).Pointer;
        if ((pcVar1->CompileDefinitionsEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar1->CompileDefinitionsEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_320,&((this->Internal).Pointer)->CompileDefinitionsEntries,";")
          ;
          std::__cxx11::string::operator=
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                     (string *)local_320);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
            return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                   _M_dataplus._M_p;
          }
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
    }
    return (char *)0x0;
  }
LAB_0028e6d8:
  pcVar11 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (pcVar11 != (char *)0x0) {
    return pcVar11;
  }
  this_01 = cmMakefile::GetState(this->Makefile);
  bVar3 = cmState::IsPropertyChained(this_01,prop,TARGET);
  if (bVar3) {
    pcVar11 = cmMakefile::GetProperty(this->Makefile,prop,true);
    return pcVar11;
  }
  return (char *)0x0;
}

Assistant:

const char *cmTarget::GetProperty(const std::string& prop,
                                  cmMakefile* context) const
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    context->IssueMessage(cmake::FATAL_ERROR, e.str());
    return 0;
    }

  // Watch for special "computed" properties that are dependent on
  // other properties or variables.  Always recompute them.
  if(this->GetType() == cmState::EXECUTABLE ||
     this->GetType() == cmState::STATIC_LIBRARY ||
     this->GetType() == cmState::SHARED_LIBRARY ||
     this->GetType() == cmState::MODULE_LIBRARY ||
     this->GetType() == cmState::UNKNOWN_LIBRARY)
    {
    static const std::string propLOCATION = "LOCATION";
    if(prop == propLOCATION)
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }

      // Set the LOCATION property of the target.
      //
      // For an imported target this is the location of an arbitrary
      // available configuration.
      //
      if(this->IsImported())
        {
        this->Properties.SetProperty(
                propLOCATION, this->ImportedGetFullPath("", false).c_str());
        }
      else
        {
        // For a non-imported target this is deprecated because it
        // cannot take into account the per-configuration name of the
        // target because the configuration type may not be known at
        // CMake time.
        cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
        gg->CreateGenerationObjects();
        cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
        this->Properties.SetProperty(propLOCATION,
                                     gt->GetLocationForBuild());
        }

      }

    // Support "LOCATION_<CONFIG>".
    else if(cmHasLiteralPrefix(prop, "LOCATION_"))
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }
      const char* configName = prop.c_str() + 9;

      if (this->IsImported())
        {
        this->Properties.SetProperty(
                prop, this->ImportedGetFullPath(configName, false).c_str());
        }
      else
        {
        cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
        gg->CreateGenerationObjects();
        cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
        this->Properties.SetProperty(
                prop, gt->GetFullPath(configName, false).c_str());
        }
      }
    // Support "<CONFIG>_LOCATION".
    else if(cmHasLiteralSuffix(prop, "_LOCATION"))
      {
      std::string configName(prop.c_str(), prop.size() - 9);
      if(configName != "IMPORTED")
        {
        if (!this->HandleLocationPropertyPolicy(context))
          {
          return 0;
          }
        if (this->IsImported())
          {
          this->Properties.SetProperty(
                  prop, this->ImportedGetFullPath(configName, false).c_str());
          }
        else
          {
          cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
          gg->CreateGenerationObjects();
          cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
          this->Properties.SetProperty(
                  prop, gt->GetFullPath(configName, false).c_str());
          }
        }
      }
    }
  static UNORDERED_SET<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) \
  static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if(specialProps.empty())
    {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propNAME);
    specialProps.insert(propBINARY_DIR);
    specialProps.insert(propSOURCE_DIR);
    specialProps.insert(propSOURCES);
    }
  if(specialProps.count(prop))
    {
    if(prop == propLINK_LIBRARIES)
      {
      if (this->Internal->LinkImplementationPropertyEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->LinkImplementationPropertyEntries, ";");
      return output.c_str();
      }
    // the type property returns what type the target is
    else if (prop == propTYPE)
      {
      return cmState::GetTargetTypeName(this->GetType());
      }
    else if(prop == propINCLUDE_DIRECTORIES)
      {
      if (this->Internal->IncludeDirectoriesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->IncludeDirectoriesEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_FEATURES)
      {
      if (this->Internal->CompileFeaturesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileFeaturesEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_OPTIONS)
      {
      if (this->Internal->CompileOptionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileOptionsEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_DEFINITIONS)
      {
      if (this->Internal->CompileDefinitionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileDefinitionsEntries, ";");
      return output.c_str();
      }
    else if (prop == propIMPORTED)
      {
      return this->IsImported()?"TRUE":"FALSE";
      }
    else if (prop == propNAME)
      {
      return this->GetName().c_str();
      }
    else if (prop == propBINARY_DIR)
      {
      return this->GetMakefile()->GetCurrentBinaryDirectory();
      }
    else if (prop == propSOURCE_DIR)
      {
      return this->GetMakefile()->GetCurrentSourceDirectory();
      }
    else if(prop == propSOURCES)
      {
      if (this->Internal->SourceEntries.empty())
        {
        return 0;
        }

      std::ostringstream ss;
      const char* sep = "";
      for(std::vector<std::string>::const_iterator
            i = this->Internal->SourceEntries.begin();
          i != this->Internal->SourceEntries.end(); ++i)
        {
        std::string const& entry = *i;

        std::vector<std::string> files;
        cmSystemTools::ExpandListArgument(entry, files);
        for (std::vector<std::string>::const_iterator
            li = files.begin(); li != files.end(); ++li)
          {
          if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
              (*li)[li->size() - 1] == '>')
            {
            std::string objLibName = li->substr(17, li->size()-18);

            if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              continue;
              }

            bool addContent = false;
            bool noMessage = true;
            std::ostringstream e;
            cmake::MessageType messageType = cmake::AUTHOR_WARNING;
            switch(context->GetPolicyStatus(cmPolicies::CMP0051))
              {
              case cmPolicies::WARN:
                e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
                noMessage = false;
              case cmPolicies::OLD:
                break;
              case cmPolicies::REQUIRED_ALWAYS:
              case cmPolicies::REQUIRED_IF_USED:
              case cmPolicies::NEW:
                addContent = true;
              }
            if (!noMessage)
              {
              e << "Target \"" << this->Name << "\" contains "
              "$<TARGET_OBJECTS> generator expression in its sources list.  "
              "This content was not previously part of the SOURCES property "
              "when that property was read at configure time.  Code reading "
              "that property needs to be adapted to ignore the generator "
              "expression using the string(GENEX_STRIP) command.";
              context->IssueMessage(messageType, e.str());
              }
            if (addContent)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              }
            }
          else if (cmGeneratorExpression::Find(*li) == std::string::npos)
            {
            ss << sep;
            sep = ";";
            ss << *li;
            }
          else
            {
            cmSourceFile *sf = this->Makefile->GetOrCreateSource(*li);
            // Construct what is known about this source file location.
            cmSourceFileLocation const& location = sf->GetLocation();
            std::string sname = location.GetDirectory();
            if(!sname.empty())
              {
              sname += "/";
              }
            sname += location.GetName();

            ss << sep;
            sep = ";";
            // Append this list entry.
            ss << sname;
            }
          }
        }
      this->Properties.SetProperty("SOURCES", ss.str().c_str());
      }
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->GetMakefile()->GetState()->
                      IsPropertyChained(prop, cmProperty::TARGET);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}